

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall QMetaStringTable::QMetaStringTable(QMetaStringTable *this,QByteArray *className)

{
  QMetaStringTable *in_RSI;
  QByteArray *in_RDI;
  int index;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  QHash<QByteArray,_int>::QHash((QHash<QByteArray,_int> *)in_RDI);
  *(undefined4 *)&(in_RDI->d).ptr = 0;
  QByteArray::QByteArray((QByteArray *)&(in_RDI->d).size,in_RDI);
  enter(in_RSI,(QByteArray *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

QMetaStringTable::QMetaStringTable(const QByteArray &className)
    : m_index(0)
    , m_className(className)
{
    const int index = enter(m_className);
    Q_ASSERT(index == 0);
    Q_UNUSED(index);
}